

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall libcellml::Variable::Variable(Variable *this,string *name)

{
  VariableImpl *pVVar1;
  string *name_local;
  Variable *this_local;
  
  pVVar1 = (VariableImpl *)operator_new(0x120);
  memset(pVVar1,0,0x120);
  VariableImpl::VariableImpl(pVVar1);
  NamedEntity::NamedEntity(&this->super_NamedEntity,(NamedEntityImpl *)pVVar1);
  std::enable_shared_from_this<libcellml::Variable>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libcellml::Variable>);
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Variable_0046a7f8;
  pVVar1 = pFunc(this);
  pVVar1->mVariable = this;
  NamedEntity::setName(&this->super_NamedEntity,name);
  return;
}

Assistant:

Variable::Variable(const std::string &name)
    : NamedEntity(new Variable::VariableImpl())
{
    pFunc()->mVariable = this;
    setName(name);
}